

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

cram_codec * cram_subexp_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  cram_codec *pcVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  pcVar2 = (cram_codec *)malloc(0x240);
  if (pcVar2 != (cram_codec *)0x0) {
    pcVar2->codec = E_SUBEXP;
    pcVar2->decode = cram_subexp_decode;
    pcVar2->free = cram_subexp_decode_free;
    bVar1 = *data;
    uVar5 = (uint)bVar1;
    lVar3 = 1;
    if ((char)bVar1 < '\0') {
      uVar4 = (uint)bVar1;
      uVar5 = (uint)(byte)data[1];
      if (bVar1 < 0xc0) {
        uVar5 = (uVar4 & 0x3f) << 8 | uVar5;
        lVar6 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar5 = (uVar4 & 0x1f) << 0x10 | uVar5 << 8 | (uint)(byte)data[2];
        lVar6 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar5 = (uVar4 & 0xf) << 0x18 | uVar5 << 0x10 | (uint)(byte)data[2] << 8 |
                (uint)(byte)data[3];
        lVar6 = 4;
      }
      else {
        uVar5 = (byte)data[4] & 0xf |
                (uint)(byte)data[3] << 4 |
                (uint)(byte)data[2] << 0xc | uVar5 << 0x14 | uVar4 << 0x1c;
        lVar6 = 5;
      }
    }
    else {
      lVar6 = 1;
    }
    *(uint *)&pcVar2->field_6 = uVar5;
    bVar1 = data[lVar6];
    uVar5 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar4 = (uint)bVar1;
      uVar5 = (uint)(byte)data[lVar6 + 1];
      if (bVar1 < 0xc0) {
        uVar5 = (uVar4 & 0x3f) << 8 | uVar5;
        lVar3 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar5 = (uVar4 & 0x1f) << 0x10 | uVar5 << 8 | (uint)(byte)data[lVar6 + 2];
        lVar3 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar5 = (uVar4 & 0xf) << 0x18 | uVar5 << 0x10 | (uint)(byte)data[lVar6 + 2] << 8 |
                (uint)(byte)data[lVar6 + 3];
        lVar3 = 4;
      }
      else {
        uVar5 = (byte)data[lVar6 + 4] & 0xf |
                (uint)(byte)data[lVar6 + 3] << 4 |
                (uint)(byte)data[lVar6 + 2] << 0xc | uVar5 << 0x14 | uVar4 << 0x1c;
        lVar3 = 5;
      }
    }
    *(uint *)((long)&pcVar2->field_6 + 4) = uVar5;
    if (lVar3 + lVar6 == (long)size) {
      return pcVar2;
    }
    cram_subexp_decode_init_cold_1();
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_subexp_decode_init(char *data, int size,
				    enum cram_external_type option,
				    int version) {
    cram_codec *c;
    char *cp = data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_SUBEXP;
    c->decode = cram_subexp_decode;
    c->free   = cram_subexp_decode_free;
    
    cp += itf8_get(cp, &c->subexp.offset);
    cp += itf8_get(cp, &c->subexp.k);

    if (cp - data != size) {
	fprintf(stderr, "Malformed subexp header stream\n");
	free(c);
	return NULL;
    }

    return c;
}